

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O2

void __thiscall MyServerConnection::OnClose(MyServerConnection *this,SDKJsonResult *reason)

{
  OutputWorker *pOVar1;
  pointer psVar2;
  TonkStatus status;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  connections;
  TonkStatus cs;
  uint8_t data [5];
  undefined3 uStack_1b3;
  ostringstream local_1a8 [376];
  
  std::__cxx11::string::string((string *)&status,(string *)&reason->ErrorJson);
  if ((int)Logger.ChannelMinLevel < 3) {
    _data = Logger.ChannelName;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,(string *)&Logger.Prefix);
    std::operator<<((ostream *)local_1a8,"MyServerConnection: OnClose(");
    std::operator<<((ostream *)local_1a8,(string *)&status);
    std::operator<<((ostream *)local_1a8,")");
    pOVar1 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar1,(LogStringBuffer *)data);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  std::__cxx11::string::~string((string *)&status);
  test::LogTonkStatus(&this->super_SDKConnection);
  tonk::SDKConnection::GetStatus(&status,&this->super_SDKConnection);
  tonk::SDKConnectionList<MyServerConnection>::GetList(&connections,&this->Server->ConnectionList);
  for (psVar2 = connections.
                super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar2 != connections.
                super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar2 = psVar2 + 1) {
    tonk::SDKConnection::GetStatus
              (&cs,&((psVar2->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->super_SDKConnection);
    if ((int)Logger.ChannelMinLevel < 3) {
      _data = Logger.ChannelName;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,(string *)&Logger.Prefix);
      std::operator<<((ostream *)local_1a8,"Informing connection ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::operator<<((ostream *)local_1a8," about ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::operator<<((ostream *)local_1a8," disconnecting");
      pOVar1 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar1,(LogStringBuffer *)data);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
    }
    data = (uint8_t  [5])CONCAT41(status.LocallyAssignedIdForRemoteHost,'\x04');
    tonk::SDKConnection::Send
              (&((psVar2->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                )->super_SDKConnection,(LogStringBuffer *)data,5,0x32);
  }
  tonk::SDKConnectionList<MyServerConnection>::Remove
            (&this->Server->ConnectionList,&this->super_SDKConnection);
  std::
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  ::~vector(&connections);
  return;
}

Assistant:

void MyServerConnection::OnClose(
    const tonk::SDKJsonResult& reason
)
{
    Logger.Info("MyServerConnection: OnClose(", reason.ToString(), ")");

    LogTonkStatus(this);

    TonkStatus status = GetStatus();

    auto connections = Server->ConnectionList.GetList();
    for (auto& connection : connections)
    {
        TonkStatus cs = connection->GetStatus();
        Logger.Info("Informing connection ", cs.LocallyAssignedIdForRemoteHost, " about ", status.LocallyAssignedIdForRemoteHost, " disconnecting");

        uint8_t data[1 + 4];
        data[0] = ID_ConnectionRemoved;
        tonk::WriteU32_LE(data + 1, status.LocallyAssignedIdForRemoteHost);
        connection->Send(data, sizeof(data), TonkChannel_Reliable0);
    }

    Server->ConnectionList.Remove(this);
}